

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_color nk_rgb(int r,int g,int b)

{
  nk_color nVar1;
  undefined4 local_3c;
  undefined1 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined1 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined1 local_20;
  undefined4 local_1c;
  int b_local;
  int g_local;
  int r_local;
  nk_color ret;
  
  local_1c = r;
  if (0xfe < r) {
    local_1c = 0xff;
  }
  if (local_1c < 0) {
    local_20 = 0;
  }
  else {
    local_24 = r;
    if (0xfe < r) {
      local_24 = 0xff;
    }
    local_20 = (undefined1)local_24;
  }
  local_28 = g;
  if (0xfe < g) {
    local_28 = 0xff;
  }
  if (local_28 < 0) {
    local_2c = 0;
  }
  else {
    local_30 = g;
    if (0xfe < g) {
      local_30 = 0xff;
    }
    local_2c = (undefined1)local_30;
  }
  local_34 = b;
  if (0xfe < b) {
    local_34 = 0xff;
  }
  if (local_34 < 0) {
    local_38 = 0;
  }
  else {
    local_3c = b;
    if (0xfe < b) {
      local_3c = 0xff;
    }
    local_38 = (undefined1)local_3c;
  }
  nVar1.r = local_20;
  nVar1.g = local_2c;
  nVar1.b = local_38;
  nVar1.a = 0xff;
  return nVar1;
}

Assistant:

NK_API struct nk_color
nk_rgb(int r, int g, int b)
{
    struct nk_color ret;
    ret.r = (nk_byte)NK_CLAMP(0, r, 255);
    ret.g = (nk_byte)NK_CLAMP(0, g, 255);
    ret.b = (nk_byte)NK_CLAMP(0, b, 255);
    ret.a = (nk_byte)255;
    return ret;
}